

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O2

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n,ConstRefVec *magnitude)

{
  string *this_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_0019a9e0;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_data = (double *)0x0;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_rows = 0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  if ((magnitude->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value == n) {
    std::__cxx11::to_string(&local_70,n);
    std::operator+(&local_50,"R",&local_70);
    this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->typicalMagnitude_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,n);
    setTypicalMagnitude(this,magnitude);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->trustMagnitude_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,n);
    setTrustMagnitude(this,magnitude);
    return;
  }
  __assert_fail("magnitude.size() == n && \"magnitude on R^n must be of size n\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/RealSpace.cpp"
                ,0x2e,"mnf::RealSpace::RealSpace(Index, const ConstRefVec &)");
}

Assistant:

RealSpace::RealSpace(Index n, const ConstRefVec& magnitude) : Manifold(n, n, n)
{
  mnf_assert(magnitude.size() == n && "magnitude on R^n must be of size n");
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  setTypicalMagnitude(magnitude);
  trustMagnitude_.resize(n);
  setTrustMagnitude(magnitude);
}